

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLgraph.c
# Opt level: O0

void RDL_DFSvisit(RDL_graph *gra,uint vertex,char *visited)

{
  uint vertex_00;
  uint local_24;
  uint j;
  uint i;
  char *visited_local;
  uint vertex_local;
  RDL_graph *gra_local;
  
  for (local_24 = 0; local_24 < gra->degree[vertex]; local_24 = local_24 + 1) {
    vertex_00 = gra->adjList[vertex][local_24][0];
    if (visited[vertex_00] == '\0') {
      visited[vertex_00] = '\x01';
      RDL_DFSvisit(gra,vertex_00,visited);
    }
  }
  return;
}

Assistant:

static void RDL_DFSvisit(const RDL_graph *gra, unsigned vertex, char *visited)
{
  unsigned i,j;
  for(i=0; i<gra->degree[vertex]; ++i)
  {
    j = gra->adjList[vertex][i][0];
    if(visited[j] == 0)
    {
      visited[j] = 1;
      RDL_DFSvisit(gra,j,visited);
    }
  }
}